

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
          (RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  uint uVar2;
  Rep *pRVar3;
  Nonnull<const_char_*> failure_msg;
  ulong uVar4;
  RepeatedPtrFieldBase *pRVar5;
  LogMessageFatal LStack_30;
  
  if (this->current_size_ < 0) {
    Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>();
  }
  if (this->current_size_ == 0) {
    return;
  }
  uVar2 = this->current_size_;
  pRVar5 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar3 = rep(this);
    pRVar5 = (RepeatedPtrFieldBase *)pRVar3->elements;
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      ppvVar1 = &pRVar5->tagged_rep_or_elem_ + uVar4;
      uVar4 = uVar4 + 1;
      (**(code **)(**ppvVar1 + 0x10))();
    } while (uVar2 != uVar4);
    this->current_size_ = 0;
    return;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)(int)uVar2,0,"n > 0");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x2ca,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_30);
}

Assistant:

void Clear() {
    const int n = current_size_;
    ABSL_DCHECK_GE(n, 0);
    if (n > 0) {
      using H = CommonHandler<TypeHandler>;
      ClearNonEmpty<H>();
    }
  }